

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O1

int32_t __thiscall helics::EndpointInfo::queueSizeUpTo(EndpointInfo *this,Time maxTime)

{
  shared_mutex *__rwlock;
  _Elt_pointer puVar1;
  Time TVar2;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *msg;
  _Elt_pointer puVar3;
  _Map_pointer ppuVar4;
  int32_t iVar5;
  _Elt_pointer puVar6;
  
  __rwlock = &(this->message_queue).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  puVar3 = (this->message_queue).m_obj.
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar1 = (this->message_queue).m_obj.
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == puVar1) {
    iVar5 = 0;
  }
  else {
    puVar6 = (this->message_queue).m_obj.
             super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar4 = (this->message_queue).m_obj.
              super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    iVar5 = 0;
    do {
      TVar2.internalTimeCode =
           (((puVar3->_M_t).
             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
             super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode;
      iVar5 = (uint)(TVar2.internalTimeCode < maxTime.internalTimeCode) + iVar5;
      if (maxTime.internalTimeCode <= TVar2.internalTimeCode) break;
      puVar3 = puVar3 + 1;
      if (puVar3 == puVar6) {
        puVar3 = ppuVar4[1];
        ppuVar4 = ppuVar4 + 1;
        puVar6 = puVar3 + 0x40;
      }
    } while (puVar3 != puVar1);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return iVar5;
}

Assistant:

int32_t EndpointInfo::queueSizeUpTo(Time maxTime) const
{
    auto handle = message_queue.lock_shared();
    int32_t cnt = 0;
    for (const auto& msg : *handle) {
        if (msg->time < maxTime) {
            ++cnt;
        } else {
            break;
        }
    }
    return cnt;
}